

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int nh_http_parse_consume_header(http_context_t *ctx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  nh_kv_anchor_t *__ptr;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  
  __ptr = (ctx->header).items;
  if (__ptr == (nh_kv_anchor_t *)0x0) {
    __ptr = (nh_kv_anchor_t *)malloc(0x80);
    (ctx->header).items = __ptr;
    (ctx->header).capacity = 8;
    (ctx->header).length = 0;
  }
  uVar2 = (ctx->raw).index;
  uVar3 = nh_stream_find_next_char_tuple(&ctx->raw,": ",0x80);
  iVar6 = 0;
  if (-1 < (int)uVar3) {
    uVar7 = uVar2 + uVar3 + 2;
    (ctx->raw).index = uVar7;
    uVar4 = nh_stream_find_next(&ctx->raw,'\r',0x400);
    if (0 < (int)uVar4) {
      (ctx->raw).index = uVar4 + uVar7;
      uVar5 = (ctx->header).length;
      if (uVar5 == (ctx->header).capacity) {
        (ctx->header).capacity = uVar5 * 2;
        __ptr = (nh_kv_anchor_t *)realloc(__ptr,(ulong)(uVar5 * 2) << 4);
        (ctx->header).items = __ptr;
        if (__ptr == (nh_kv_anchor_t *)0x0) {
          __assert_fail("ctx->header.items != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                        ,0x21b,"int nh_http_parse_consume_header(http_context_t *)");
        }
        uVar5 = (ctx->header).length;
      }
      __ptr[uVar5].key.index = uVar2;
      __ptr[uVar5].key.len = uVar3;
      __ptr[uVar5].value.index = uVar7;
      __ptr[uVar5].value.len = uVar4;
      puVar1 = &(ctx->header).length;
      *puVar1 = *puVar1 + 1;
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int nh_http_parse_consume_header(http_context_t *ctx) {
    if (ctx->header.items == NULL) {
        ctx->header.items = (nh_kv_anchor_t *) malloc(sizeof(nh_kv_anchor_t) * REQUEST_HEADER_INIT_SIZE);
        ctx->header.capacity = REQUEST_HEADER_INIT_SIZE;
        ctx->header.length = 0;
    }

    nh_stream_t *stream = &ctx->raw;
    uint32_t key_index = stream->index;
    int key_offset;
    if ((key_offset = nh_stream_find_next_char_tuple(stream, ": ", 128)) < 0) return 0;

    stream->index += key_offset + 2;
    uint32_t value_index = stream->index;

    int value_offset;
    if ((value_offset = nh_stream_find_next(stream, '\r', 1024)) <= 0) return 0;

    stream->index += value_offset;

    if (ctx->header.length == ctx->header.capacity) {
        ctx->header.capacity *= 2;
        ctx->header.items = (nh_kv_anchor_t *) realloc(ctx->header.items,
                                                       ctx->header.capacity * sizeof(nh_kv_anchor_t));
        assert(ctx->header.items != NULL);
    }

    ctx->header.items[ctx->header.length] = (nh_kv_anchor_t) {
        .key = {.index = key_index, .len = key_offset},
        .value = {.index = value_index, .len = value_offset}
    };
    ctx->header.length++;
    return 1;
}